

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processLocalQuery(CoreBroker *this,ActionMessage *message)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  action_t aVar2;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *this_00;
  mapped_type *pmVar3;
  ActionMessage *in_RSI;
  long in_RDI;
  string_view sVar4;
  ActionMessage queryRep;
  bool force_ordered;
  undefined1 in_stack_000009c7;
  CoreBroker *in_stack_000009c8;
  string_view in_stack_000009d0;
  ActionMessage *in_stack_fffffffffffffde0;
  value_type *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  action_t in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  GlobalFederateId in_stack_fffffffffffffe04;
  SmallBuffer *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  bool local_199;
  undefined1 local_191 [9];
  char *local_188;
  BaseType local_15c;
  string_view local_158;
  byte local_148 [12];
  BaseType local_13c;
  string_view local_128;
  string_view local_108;
  BaseType local_d8;
  GlobalFederateId local_d4 [2];
  int32_t local_cc;
  BaseType local_c8;
  GlobalFederateId local_c0 [2];
  uint16_t local_b8;
  bool local_11;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  aVar2 = ActionMessage::action(in_RSI);
  local_199 = true;
  if (aVar2 != cmd_query_ordered) {
    aVar2 = ActionMessage::action(local_10);
    local_199 = aVar2 == cmd_broker_query_ordered;
  }
  local_11 = local_199;
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe04.gid,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdfc);
  local_d8 = *(BaseType *)(in_RDI + 0x14);
  GlobalFederateId::GlobalFederateId(local_d4,(GlobalBrokerId)local_d8);
  local_c8 = local_d4[0].gid;
  local_c0[0].gid = (local_10->source_id).gid;
  local_cc = local_10->messageID;
  local_108 = SmallBuffer::to_string((SmallBuffer *)0x53165f);
  generateQueryAnswer_abi_cxx11_(in_stack_000009c8,in_stack_000009d0,(bool)in_stack_000009c7);
  SmallBuffer::operator=
            (in_stack_fffffffffffffe08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe04.gid,in_stack_fffffffffffffe00));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  local_b8 = local_10->counter;
  sVar4 = SmallBuffer::to_string((SmallBuffer *)0x5316fe);
  local_128 = sVar4;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (char *)in_stack_fffffffffffffde8);
  __x._M_str = (char *)in_stack_fffffffffffffe10;
  __x._M_len = (size_t)in_stack_fffffffffffffe08;
  __y._M_len._4_4_ = in_stack_fffffffffffffdfc;
  __y._M_len._0_4_ = in_stack_fffffffffffffdf8;
  __y._M_str._0_4_ = in_stack_fffffffffffffe00;
  __y._M_str._4_4_ = in_stack_fffffffffffffe04.gid;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_13c = *(BaseType *)(in_RDI + 0x14);
    bVar1 = GlobalFederateId::operator==(local_c0,(GlobalBrokerId)local_13c);
    if (bVar1) {
      bVar1 = std::
              deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ::empty((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                       *)0x5317ad);
      if (bVar1) {
        BrokerBase::setTickForwarding((BrokerBase *)(in_RDI + 8),QUERY_TIMEOUT,true);
      }
      local_148._0_8_ = std::chrono::_V2::steady_clock::now();
      std::
      deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
      ::
      emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 &in_stack_fffffffffffffde8->messageAction,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffde0);
    }
    this_00 = (vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
               *)(in_RDI + 0xaf8);
    local_158 = SmallBuffer::to_string((SmallBuffer *)0x53187d);
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
             ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe04.gid,in_stack_fffffffffffffe00),
                  (key_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::
    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
    ::operator[](this_00,(ulong)pmVar3->first);
    std::
    get<1ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
              ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                *)0x5318da);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
  }
  else {
    local_15c = *(BaseType *)(in_RDI + 0x14);
    bVar1 = GlobalFederateId::operator==(local_c0,(GlobalBrokerId)local_15c);
    if (bVar1) {
      join_0x00000010_0x00000000_ = SmallBuffer::to_string((SmallBuffer *)0x531953);
      in_stack_fffffffffffffde0 = (ActionMessage *)local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)sVar4._M_len,sVar4._M_str._4_4_,in_stack_fffffffffffffe30);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffde0);
      std::allocator<char>::~allocator((allocator<char> *)local_191);
    }
    else {
      routeMessage((CoreBroker *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffe04);
    }
  }
  ActionMessage::~ActionMessage(in_stack_fffffffffffffde0);
  return;
}

Assistant:

void CoreBroker::processLocalQuery(const ActionMessage& message)
{
    const bool force_ordered =
        (message.action() == CMD_QUERY_ORDERED || message.action() == CMD_BROKER_QUERY_ORDERED);
    ActionMessage queryRep(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
    queryRep.source_id = global_broker_id_local;
    queryRep.dest_id = message.source_id;
    queryRep.messageID = message.messageID;
    queryRep.payload = generateQueryAnswer(message.payload.to_string(), force_ordered);
    queryRep.counter = message.counter;
    if (queryRep.payload.to_string() == "#wait") {
        if (queryRep.dest_id == global_broker_id_local) {
            if (queryTimeouts.empty()) {
                setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
            }
            queryTimeouts.emplace_back(queryRep.messageID, std::chrono::steady_clock::now());
        }
        std::get<1>(mapBuilders[mapIndex.at(message.payload.to_string()).first])
            .push_back(queryRep);
    } else if (queryRep.dest_id == global_broker_id_local) {
        activeQueries.setDelayedValue(message.messageID, std::string(queryRep.payload.to_string()));
    } else {
        routeMessage(std::move(queryRep), message.source_id);
    }
}